

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

vertex_iterator __thiscall
xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
ObtainVertexFromVertexMap
          (Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>
           *this,StateExample state)

{
  bool bVar1;
  __node_type *p_Var2;
  vertex_iterator vVar3;
  pair<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>
  *in_RDI;
  Vertex *new_vertex;
  iterator it;
  int64_t state_id;
  DefaultIndexer<xmotion::StateExample> *in_stack_ffffffffffffff58;
  Vertex **this_00;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  in_stack_ffffffffffffff60;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  s;
  unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
  *in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  StateExample in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  local_30 [2];
  int64_t local_20;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  local_8;
  
  local_20 = DefaultIndexer<xmotion::StateExample>::operator()<xmotion::StateExample,_true>
                       (in_stack_ffffffffffffff58,(StateExample)in_stack_ffffffffffffff60._M_cur);
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
       ::find((unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
               *)in_stack_ffffffffffffff58,(key_type *)0x10c6ff);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
       ::end((unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator==(local_30,&local_38);
  if (bVar1) {
    p_Var2 = (__node_type *)operator_new(0x70);
    Vertex::Vertex((Vertex *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff80);
    s._M_cur = p_Var2;
    vVar3 = vertex_end((Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>
                        *)in_stack_ffffffffffffff58);
    p_Var2[4].
    super__Hash_node_value<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
    .
    super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>
    ._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)
         vVar3.super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
         ._M_cur;
    this_00 = &in_RDI->second;
    std::
    make_pair<long&,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*&>
              ((long *)s._M_cur,this_00);
    std::
    unordered_map<long,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>>>
    ::
    insert<std::pair<long,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>>
              (in_stack_ffffffffffffff70,in_RDI);
    std::
    unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
    ::find((unordered_map<long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>_>
            *)this_00,(key_type *)0x10c7e5);
    vertex_iterator::vertex_iterator((vertex_iterator *)this_00,(VertexMapTypeIterator)s._M_cur);
  }
  else {
    vertex_iterator::vertex_iterator
              ((vertex_iterator *)in_stack_ffffffffffffff58,
               (VertexMapTypeIterator)in_stack_ffffffffffffff60._M_cur);
  }
  return (vertex_iterator)
         (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
          )local_8._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}